

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crawler.cpp
# Opt level: O0

void __thiscall Crawler::genNewId(Crawler *this)

{
  undefined8 __stream;
  bdNodeId *pbVar1;
  undefined8 uVar2;
  undefined1 local_50 [8];
  string stringID;
  FILE *myIDs;
  bdStackMutex local_18;
  bdStackMutex stack;
  Crawler *this_local;
  
  stack.mMtx = (bdMutex *)this;
  bdStackMutex::bdStackMutex(&local_18,&this->crwlrMutex);
  pbVar1 = (bdNodeId *)operator_new(0x14);
  pbVar1->data[0] = '\0';
  pbVar1->data[1] = '\0';
  pbVar1->data[2] = '\0';
  pbVar1->data[3] = '\0';
  pbVar1->data[4] = '\0';
  pbVar1->data[5] = '\0';
  pbVar1->data[6] = '\0';
  pbVar1->data[7] = '\0';
  pbVar1->data[8] = '\0';
  pbVar1->data[9] = '\0';
  pbVar1->data[10] = '\0';
  pbVar1->data[0xb] = '\0';
  pbVar1->data[0xc] = '\0';
  pbVar1->data[0xd] = '\0';
  pbVar1->data[0xe] = '\0';
  pbVar1->data[0xf] = '\0';
  pbVar1->data[0x10] = '\0';
  pbVar1->data[0x11] = '\0';
  pbVar1->data[0x12] = '\0';
  pbVar1->data[0x13] = '\0';
  this->peerId = pbVar1;
  bdStdRandomNodeId(this->peerId);
  std::operator<<((ostream *)&std::cerr,"Starting with ownID: ");
  bdStdPrintNodeId((ostream *)&std::cerr,this->peerId);
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  stringID.field_2._8_8_ = fopen("my_ids","a+");
  std::__cxx11::string::string((string *)local_50);
  bdStdPrintNodeId((string *)local_50,this->peerId,false);
  __stream = stringID.field_2._8_8_;
  uVar2 = std::__cxx11::string::c_str();
  fprintf((FILE *)__stream,"%s\n",uVar2);
  fclose((FILE *)stringID.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_50);
  bdStackMutex::~bdStackMutex(&local_18);
  return;
}

Assistant:

void Crawler::genNewId() {
    bdStackMutex stack(crwlrMutex); /********** MUTEX LOCKED *************/
    peerId = new bdNodeId();
    bdStdRandomNodeId(peerId);
    std::cerr << "Starting with ownID: ";
    bdStdPrintNodeId(std::cerr, peerId);
    std::cerr << std::endl;
    FILE *myIDs = fopen(USED_IDS_FILENAME, "a+");
    std::string stringID;
    bdStdPrintNodeId(stringID, peerId, false);
    fprintf(myIDs, "%s\n", stringID.c_str());
    fclose(myIDs);
}